

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void write_srec(char *file,char *ext,int base)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  int iVar3;
  byte bVar4;
  long lVar5;
  char *__format;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  char fname [128];
  uchar (*local_e8) [8192];
  char local_b8 [136];
  
  if (((*ext == 'm') && (ext[1] == 'x')) && (ext[2] == '\0')) {
    __format = "writing mx file... ";
  }
  else {
    __format = "writing s-record file... ";
  }
  printf(__format);
  fflush(_stdout);
  strcpy(local_b8,file);
  sVar2 = strlen(local_b8);
  (local_b8 + sVar2)[0] = '.';
  (local_b8 + sVar2)[1] = '\0';
  strcat(local_b8,ext);
  __stream = fopen(local_b8,"w");
  if (__stream == (FILE *)0x0) {
    printf("can not open file \'%s\'!\n",local_b8);
  }
  else {
    local_e8 = rom;
    iVar8 = 0;
    uVar9 = 0;
    for (lVar6 = 0; lVar6 <= max_bank; lVar6 = lVar6 + 1) {
      for (uVar7 = 0; uVar7 != 0x2000; uVar7 = uVar7 + 1) {
        if (map[lVar6][uVar7] == 0xff) {
          bVar10 = iVar8 != 0;
        }
        else {
          if (iVar8 == 0) {
            uVar9 = uVar7 & 0xffffffff;
          }
          iVar8 = iVar8 + 1;
          bVar10 = iVar8 == 0x20;
        }
        if ((bool)((iVar8 != 0 && uVar7 == 0x1fff) | bVar10)) {
          iVar1 = (int)uVar9;
          iVar3 = (int)lVar6 * 0x2000 + base + iVar1;
          bVar4 = (char)((uint)iVar3 >> 0x10) + (char)iVar3 + (char)iVar8 + (char)((uint)iVar3 >> 8)
                  + 4;
          fprintf(__stream,"S2%02X%06X",(ulong)(iVar8 + 4));
          for (lVar5 = 0; iVar8 != (int)lVar5; lVar5 = lVar5 + 1) {
            bVar4 = bVar4 + (*local_e8)[lVar5 + iVar1];
            fprintf(__stream,"%02X",(ulong)(*local_e8)[lVar5 + iVar1]);
          }
          uVar9 = (ulong)(uint)(iVar1 + (int)lVar5);
          iVar8 = 0;
          fprintf(__stream,"%02X\n",(ulong)(byte)~bVar4);
        }
      }
      local_e8 = local_e8 + 1;
    }
    fprintf(__stream,"S804%06X%02X",(ulong)((map[0][0] & 0xe0) << 8),
            (ulong)(map[0][0] & 0xffffffe0 ^ 0xfb));
    fclose(__stream);
    puts("OK");
  }
  return;
}

Assistant:

void
write_srec(char *file, char *ext, int base)
{
	unsigned char data, chksum;
	char  fname[128];
	int   addr, dump, cnt, pos, i, j;
	FILE *fp;

	/* status message */
	if (!strcmp(ext, "mx"))
		printf("writing mx file... ");
	else
		printf("writing s-record file... ");

	/* flush output */
	fflush(stdout);

	/* add the file extension */
	strcpy(fname, file);
	strcat(fname, ".");
	strcat(fname, ext);

	/* open the file */
	if ((fp = fopen(fname, "w")) == NULL) {
		printf("can not open file '%s'!\n", fname);
		return;
	}

	/* dump the rom */
	dump = 0;
	cnt  = 0;
	pos  = 0;

	for (i = 0; i <= max_bank; i++) {
		for (j = 0; j < 8192; j++) {
			if (map[i][j] != 0xFF) {
				/* data byte */
				if (cnt == 0)
					pos = j;
				cnt++;
				if (cnt == 32)
					dump = 1;
			}
			else {
				/* free byte */
				if (cnt)
					dump = 1;
			}
			if (j == 8191)
				if (cnt)
					dump = 1;

			/* dump */
			if (dump) {
				dump = 0;
				addr = base + (i << 13) + pos;
				chksum = cnt + ((addr >> 16) & 0xFF) +
							   ((addr >> 8) & 0xFF) +
							   ((addr) & 0xFF) +
							   4;

				/* number, address */
				fprintf(fp, "S2%02X%06X", cnt + 4, addr);

				/* code */
				while (cnt) {
					data = rom[i][pos++];
					chksum += data;
					fprintf(fp, "%02X", data);
					cnt--;
				}

				/* chksum */
				fprintf(fp, "%02X\n", (~chksum) & 0xFF);
			}
		}
	}

	/* starting address */
	addr   = ((map[0][0] >> 5) << 13);
	chksum = ((addr >> 8) & 0xFF) + (addr & 0xFF) + 4;
	fprintf(fp, "S804%06X%02X", addr, (~chksum) & 0xFF);

	/* ok */
	fclose(fp);
	printf("OK\n");
}